

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpxWrapper.cpp
# Opt level: O0

HighsStatus reportIpxIpmCrossoverStatus(HighsOptions *options,Int status,bool ipm_status)

{
  __type _Var1;
  undefined8 uVar2;
  HighsLogOptions *pHVar3;
  byte in_DL;
  int in_ESI;
  long in_RDI;
  string method_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string local_38 [35];
  byte local_15;
  int local_14;
  long local_10;
  HighsStatus local_4;
  
  local_15 = in_DL & 1;
  local_14 = in_ESI;
  local_10 = in_RDI;
  std::__cxx11::string::string(local_38);
  if ((local_15 & 1) == 0) {
    std::__cxx11::string::operator=(local_38,"Crossover");
  }
  else {
    std::__cxx11::string::operator=(local_38,"IPM      ");
  }
  if (local_14 == 0) {
    if ((local_15 & 1) == 0) {
      _Var1 = std::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if (!_Var1) {
        local_4 = kOk;
        goto LAB_0047e1bc;
      }
    }
    uVar2 = std::__cxx11::string::c_str();
    highsLogUser((HighsLogOptions *)(local_10 + 0x380),kWarning,"Ipx: %s not run\n",uVar2);
    local_4 = kWarning;
  }
  else if (local_14 == 1) {
    uVar2 = std::__cxx11::string::c_str();
    highsLogUser((HighsLogOptions *)(local_10 + 0x380),kInfo,"Ipx: %s optimal\n",uVar2);
    local_4 = kOk;
  }
  else if (local_14 == 2) {
    uVar2 = std::__cxx11::string::c_str();
    highsLogUser((HighsLogOptions *)(local_10 + 0x380),kWarning,"Ipx: %s imprecise\n",uVar2);
    local_4 = kWarning;
  }
  else if (local_14 == 3) {
    uVar2 = std::__cxx11::string::c_str();
    highsLogUser((HighsLogOptions *)(local_10 + 0x380),kWarning,"Ipx: %s primal infeasible\n",uVar2)
    ;
    local_4 = kWarning;
  }
  else if (local_14 == 4) {
    uVar2 = std::__cxx11::string::c_str();
    highsLogUser((HighsLogOptions *)(local_10 + 0x380),kWarning,"Ipx: %s dual infeasible\n",uVar2);
    local_4 = kWarning;
  }
  else if (local_14 == 5) {
    uVar2 = std::__cxx11::string::c_str();
    highsLogUser((HighsLogOptions *)(local_10 + 0x380),kWarning,"Ipx: %s user interrupt\n",uVar2);
    local_4 = kOk;
  }
  else if (local_14 == 6) {
    pHVar3 = (HighsLogOptions *)(local_10 + 0x380);
    uVar2 = std::__cxx11::string::c_str();
    highsLogUser(pHVar3,kWarning,"Ipx: %s reached time limit\n",uVar2);
    local_4 = kWarning;
  }
  else if (local_14 == 7) {
    pHVar3 = (HighsLogOptions *)(local_10 + 0x380);
    uVar2 = std::__cxx11::string::c_str();
    highsLogUser(pHVar3,kWarning,"Ipx: %s reached iteration limit\n",uVar2);
    local_4 = kWarning;
  }
  else if (local_14 == 8) {
    uVar2 = std::__cxx11::string::c_str();
    highsLogUser((HighsLogOptions *)(local_10 + 0x380),kWarning,"Ipx: %s no progress\n",uVar2);
    local_4 = kWarning;
  }
  else if (local_14 == 9) {
    uVar2 = std::__cxx11::string::c_str();
    highsLogUser((HighsLogOptions *)(local_10 + 0x380),kError,"Ipx: %s failed\n",uVar2);
    local_4 = kError;
  }
  else if (local_14 == 10) {
    uVar2 = std::__cxx11::string::c_str();
    highsLogUser((HighsLogOptions *)(local_10 + 0x380),kError,"Ipx: %s debug\n",uVar2);
    local_4 = kError;
  }
  else {
    uVar2 = std::__cxx11::string::c_str();
    highsLogUser((HighsLogOptions *)(local_10 + 0x380),kError,"Ipx: %s unrecognised status\n",uVar2)
    ;
    local_4 = kError;
  }
LAB_0047e1bc:
  std::__cxx11::string::~string(local_38);
  return local_4;
}

Assistant:

HighsStatus reportIpxIpmCrossoverStatus(const HighsOptions& options,
                                        const ipx::Int status,
                                        const bool ipm_status) {
  std::string method_name;
  if (ipm_status)
    method_name = "IPM      ";
  else
    method_name = "Crossover";
  if (status == IPX_STATUS_not_run) {
    if (ipm_status || options.run_crossover == kHighsOnString) {
      // Warn if method not run is IPM or method not run is crossover
      // and run_crossover option is "on"
      highsLogUser(options.log_options, HighsLogType::kWarning,
                   "Ipx: %s not run\n", method_name.c_str());
      return HighsStatus::kWarning;
    }
    // OK if method not run is crossover and run_crossover option is
    // not "on"
    return HighsStatus::kOk;
  } else if (status == IPX_STATUS_optimal) {
    highsLogUser(options.log_options, HighsLogType::kInfo, "Ipx: %s optimal\n",
                 method_name.c_str());
    return HighsStatus::kOk;
  } else if (status == IPX_STATUS_imprecise) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Ipx: %s imprecise\n", method_name.c_str());
    return HighsStatus::kWarning;
  } else if (status == IPX_STATUS_primal_infeas) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Ipx: %s primal infeasible\n", method_name.c_str());
    return HighsStatus::kWarning;
  } else if (status == IPX_STATUS_dual_infeas) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Ipx: %s dual infeasible\n", method_name.c_str());
    return HighsStatus::kWarning;
  } else if (status == IPX_STATUS_user_interrupt) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Ipx: %s user interrupt\n", method_name.c_str());
    return HighsStatus::kOk;
  } else if (status == IPX_STATUS_time_limit) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Ipx: %s reached time limit\n", method_name.c_str());
    return HighsStatus::kWarning;
  } else if (status == IPX_STATUS_iter_limit) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Ipx: %s reached iteration limit\n", method_name.c_str());
    return HighsStatus::kWarning;
  } else if (status == IPX_STATUS_no_progress) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Ipx: %s no progress\n", method_name.c_str());
    return HighsStatus::kWarning;
  } else if (status == IPX_STATUS_failed) {
    highsLogUser(options.log_options, HighsLogType::kError, "Ipx: %s failed\n",
                 method_name.c_str());
    return HighsStatus::kError;
  } else if (status == IPX_STATUS_debug) {
    highsLogUser(options.log_options, HighsLogType::kError, "Ipx: %s debug\n",
                 method_name.c_str());
    return HighsStatus::kError;
  } else {
    highsLogUser(options.log_options, HighsLogType::kError,
                 "Ipx: %s unrecognised status\n", method_name.c_str());
    return HighsStatus::kError;
  }
  return HighsStatus::kError;
}